

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

Am_Object * __thiscall
Am_Object::Set(Am_Object *this,Am_Slot_Key key,Am_Value *value,Am_Slot_Flags set_flags)

{
  ostream *poVar1;
  Am_Slot_Flags set_flags_local;
  Am_Value *value_local;
  Am_Slot_Key key_local;
  Am_Object *this_local;
  
  if (this->data == (Am_Object_Data *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
    poVar1 = std::operator<<(poVar1,"** Set called on a (0L) object.");
    poVar1 = ::operator<<(poVar1,this);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    Am_Error();
  }
  (*cc->_vptr_Am_Constraint_Context[2])(cc,this,(ulong)key,value,set_flags | 8);
  return this;
}

Assistant:

Am_Object &Am_Object::Set(Am_Slot_Key key,
                                          const Am_Value &value,
                                          Am_Slot_Flags set_flags)
{
  if (!data)
    Am_ERROR("** Set called on a (0L) object." << *this);
  cc->Set((const Am_Object_Advanced &)*this, key, value,
          set_flags | Am_OK_IF_THERE);
  return *this;
}